

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O3

void __thiscall
Fixpp::result::
Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
::Result(Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
         *this,Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
               *other)

{
  undefined8 uVar1;
  storage_type *psVar2;
  long lVar3;
  long lVar4;
  string *psVar5;
  bool bVar6;
  
  psVar5 = (string *)&this->storage_;
  (this->storage_).initialized_ = false;
  psVar2 = &other->storage_;
  bVar6 = other->ok_ == false;
  if (bVar6) {
    uVar1 = *(undefined8 *)((long)&(other->storage_).storage_ + 8);
    (((storage_type *)psVar5)->storage_).__align = (psVar2->storage_).__align;
    *(undefined8 *)((long)&(this->storage_).storage_ + 8) = uVar1;
    psVar5 = (string *)((long)&(this->storage_).storage_ + 0x10);
    psVar2 = (storage_type *)((long)&(other->storage_).storage_ + 0x10);
    lVar3 = 0x20;
    lVar4 = 0x28;
  }
  else {
    lVar3 = 0x10;
    lVar4 = 0x18;
  }
  *(bool **)psVar5 = &this->ok_ + lVar4;
  std::__cxx11::string::_M_construct<char*>
            (psVar5,(psVar2->storage_).__align,
             *(long *)(&other->ok_ + lVar3) + (long)(psVar2->storage_).__align);
  (this->storage_).initialized_ = true;
  this->ok_ = !bVar6;
  return;
}

Assistant:

Result(const Result& other) {
        if (other.isOk()) {
            details::Constructor<T, E>::copy(other.storage_, storage_, details::ok_tag());
            ok_ = true;
        } else {
            details::Constructor<T, E>::copy(other.storage_, storage_, details::err_tag());
            ok_ = false;
        }
    }